

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.h
# Opt level: O2

void __thiscall clunk::Move::Init(Move *this,uint32_t bits,int score)

{
  bool bVar1;
  uint uVar2;
  char *__assertion;
  
  this->bits = bits;
  this->score = score;
  uVar2 = -score;
  if (0 < score) {
    uVar2 = score;
  }
  if (uVar2 < 0x7d01) {
    if (bits != 0) {
      bVar1 = IsValid(this);
      if (!bVar1) {
        __assertion = "!bits || IsValid()";
        uVar2 = 0x48;
        goto LAB_0012f1f7;
      }
    }
    return;
  }
  __assertion = "abs(score) <= Infinity";
  uVar2 = 0x47;
LAB_0012f1f7:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Move.h",
                uVar2,"void clunk::Move::Init(const uint32_t, const int)");
}

Assistant:

void Init(const uint32_t bits, const int score) {
    this->bits = bits;
    this->score = static_cast<int32_t>(score);
    assert(abs(score) <= Infinity);
    assert(!bits || IsValid());
  }